

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

uint_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::getNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this)

{
  undefined4 local_1c;
  undefined4 local_18;
  int_type i;
  uint_type significand;
  int_type unbiased_exponent;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *this_local;
  
  local_1c = getUnbiasedNormalizedExponent(this);
  local_18 = getSignificandBits(this);
  for (; local_1c < -0x7e; local_1c = local_1c + 1) {
    local_18 = local_18 << 1;
  }
  return local_18 & 0x7fffff;
}

Assistant:

const uint_type getNormalizedSignificand() const {
    int_type unbiased_exponent = getUnbiasedNormalizedExponent();
    uint_type significand = getSignificandBits();
    for (int_type i = unbiased_exponent; i <= min_exponent; ++i) {
      significand = static_cast<uint_type>(significand << 1);
    }
    significand &= fraction_encode_mask;
    return significand;
  }